

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void read_palette_colors_y(MACROBLOCKD *xd,int bit_depth,PALETTE_MODE_INFO *pmi,aom_reader *r)

{
  int iVar1;
  uint n_colors;
  int iVar2;
  uint16_t *in_RDX;
  int in_ESI;
  int delta;
  int range;
  int bits;
  int min_bits;
  int n_cached_colors;
  int i;
  int idx;
  int n;
  int n_cache;
  uint16_t cached_colors [8];
  uint16_t color_cache [16];
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int local_74;
  int local_68;
  int local_64;
  uint16_t local_58 [8];
  uint16_t local_48 [8];
  uint16_t *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  MACROBLOCKD *in_stack_ffffffffffffffd8;
  
  iVar1 = av1_get_palette_cache
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  n_colors = (uint)(byte)in_RDX[0x18];
  local_64 = 0;
  for (local_68 = 0; iVar2 = local_64, local_68 < iVar1 && local_64 < (int)n_colors;
      local_68 = local_68 + 1) {
    iVar2 = aom_read_bit_((aom_reader *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (iVar2 != 0) {
      local_58[local_64] = local_48[local_68];
      local_64 = local_64 + 1;
    }
  }
  if (local_64 < (int)n_colors) {
    iVar1 = aom_read_literal_((aom_reader *)
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              in_stack_ffffffffffffff6c);
    in_RDX[local_64] = (uint16_t)iVar1;
    if (local_64 + 1 < (int)n_colors) {
      local_74 = aom_read_literal_((aom_reader *)
                                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                   in_stack_ffffffffffffff6c);
      local_74 = in_ESI + -3 + local_74;
      for (local_64 = local_64 + 1; local_64 < (int)n_colors; local_64 = local_64 + 1) {
        iVar1 = aom_read_literal_((aom_reader *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c);
        iVar1 = clamp((uint)in_RDX[local_64 + -1] + iVar1 + 1,0,(1 << ((byte)in_ESI & 0x1f)) + -1);
        in_RDX[local_64] = (uint16_t)iVar1;
        iVar1 = av1_ceil_log2(0x1cbe4f);
        if (iVar1 <= local_74) {
          local_74 = av1_ceil_log2(0x1cbe6c);
        }
        in_stack_ffffffffffffff74 = local_74;
      }
    }
    merge_colors(in_RDX,local_58,n_colors,iVar2);
  }
  else {
    memcpy(in_RDX,local_58,(long)(int)n_colors << 1);
  }
  return;
}

Assistant:

static void read_palette_colors_y(MACROBLOCKD *const xd, int bit_depth,
                                  PALETTE_MODE_INFO *const pmi, aom_reader *r) {
  uint16_t color_cache[2 * PALETTE_MAX_SIZE];
  uint16_t cached_colors[PALETTE_MAX_SIZE];
  const int n_cache = av1_get_palette_cache(xd, 0, color_cache);
  const int n = pmi->palette_size[0];
  int idx = 0;
  for (int i = 0; i < n_cache && idx < n; ++i)
    if (aom_read_bit(r, ACCT_STR)) cached_colors[idx++] = color_cache[i];
  if (idx < n) {
    const int n_cached_colors = idx;
    pmi->palette_colors[idx++] = aom_read_literal(r, bit_depth, ACCT_STR);
    if (idx < n) {
      const int min_bits = bit_depth - 3;
      int bits = min_bits + aom_read_literal(r, 2, ACCT_STR);
      int range = (1 << bit_depth) - pmi->palette_colors[idx - 1] - 1;
      for (; idx < n; ++idx) {
        assert(range >= 0);
        const int delta = aom_read_literal(r, bits, ACCT_STR) + 1;
        pmi->palette_colors[idx] = clamp(pmi->palette_colors[idx - 1] + delta,
                                         0, (1 << bit_depth) - 1);
        range -= (pmi->palette_colors[idx] - pmi->palette_colors[idx - 1]);
        bits = AOMMIN(bits, av1_ceil_log2(range));
      }
    }
    merge_colors(pmi->palette_colors, cached_colors, n, n_cached_colors);
  } else {
    memcpy(pmi->palette_colors, cached_colors, n * sizeof(cached_colors[0]));
  }
}